

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

ostream * std::operator<<(ostream *os,texcoord2d *v)

{
  ostream *poVar1;
  char *this;
  _anonymous_namespace_ *this_00;
  string local_60;
  string local_40;
  
  this = "(";
  poVar1 = std::operator<<(os,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_40,(_anonymous_namespace_ *)this,v->s);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  this_00 = (_anonymous_namespace_ *)0x2f37b4;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_60,this_00,v->t);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  std::operator<<(poVar1,")");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os,
                         const tinyusdz::value::texcoord2d &v) {
  os << "(" << tinyusdz::dtos(v.s) << ", " << tinyusdz::dtos(v.t) << ")";
  return os;
}